

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

void __thiscall Minisat::Solver::simpleUncheckEnqueue(Solver *this,Lit p,CRef from)

{
  VarData *pVVar1;
  int iVar2;
  
  iVar2 = p.x >> 1;
  (this->assigns).data[iVar2].value = (byte)p.x & 1;
  pVVar1 = (this->vardata).data;
  pVVar1[iVar2].reason = from;
  pVVar1[iVar2].level = (this->trail_lim).sz;
  iVar2 = (this->trail).sz;
  (this->trail).sz = iVar2 + 1;
  (this->trail).data[iVar2].x = p.x;
  return;
}

Assistant:

explicit lbool(bool x) : value(!x) {}